

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_pardon(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *ch_00;
  char arg2 [4608];
  char arg1 [4608];
  char local_2418 [4608];
  char local_1218 [4616];
  
  pcVar2 = one_argument(argument,local_1218);
  one_argument(pcVar2,local_2418);
  if ((local_1218[0] != '\0') && (local_2418[0] != '\0')) {
    ch_00 = get_char_world(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar2 = "They aren\'t here.\n\r";
      goto LAB_0026b8e0;
    }
    bVar1 = is_npc(ch_00);
    if (bVar1) {
      pcVar2 = "Not on NPC\'s.\n\r";
      goto LAB_0026b8e0;
    }
    bVar1 = str_cmp(local_2418,"killer");
    if (!bVar1) {
      if (((uint)ch_00->act[0] >> 0x1a & 1) == 0) {
        return;
      }
      ch_00->act[0] = ch_00->act[0] & 0xfffffffffbffffff;
      send_to_char("Killer flag removed.\n\r",ch);
      pcVar2 = "You are no longer a KILLER.\n\r";
      ch = ch_00;
      goto LAB_0026b8e0;
    }
    bVar1 = str_cmp(local_2418,"thief");
    if (!bVar1) {
      if (((uint)ch_00->act[0] >> 0x19 & 1) == 0) {
        return;
      }
      ch_00->act[0] = ch_00->act[0] & 0xfffffffffdffffff;
      send_to_char("Thief flag removed.\n\r",ch);
      pcVar2 = "You are no longer a THIEF.\n\r";
      ch = ch_00;
      goto LAB_0026b8e0;
    }
  }
  pcVar2 = "Syntax: pardon <character> <killer|thief>.\n\r";
LAB_0026b8e0:
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_pardon(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax: pardon <character> <killer|thief>.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	if (!str_cmp(arg2, "killer"))
	{
		if (IS_SET(victim->act, PLR_KILLER))
		{
			REMOVE_BIT(victim->act, PLR_KILLER);

			send_to_char("Killer flag removed.\n\r", ch);
			send_to_char("You are no longer a KILLER.\n\r", victim);
		}

		return;
	}

	if (!str_cmp(arg2, "thief"))
	{
		if (IS_SET(victim->act, PLR_THIEF))
		{
			REMOVE_BIT(victim->act, PLR_THIEF);

			send_to_char("Thief flag removed.\n\r", ch);
			send_to_char("You are no longer a THIEF.\n\r", victim);
		}

		return;
	}

	send_to_char("Syntax: pardon <character> <killer|thief>.\n\r", ch);
}